

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::DwaCompressor::uncompress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  vector<char*,std::allocator<char*>> *this_00;
  char *pcVar1;
  char *pcVar2;
  uint maxY;
  uint minY;
  CompressorScheme CVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  unsigned_short *raw;
  iterator __position;
  byte bVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  long lVar46;
  char *pcVar47;
  pointer pCVar48;
  char *pcVar49;
  InputExc *this_01;
  NoImplExc *this_02;
  BaseExc *this_03;
  ulong uVar50;
  code *pcVar51;
  uint uVar52;
  char *packedAc;
  ushort uVar53;
  short sVar54;
  undefined *puVar55;
  uint uVar56;
  undefined1 *toLinear;
  int byte;
  ulong uVar57;
  pointer pCVar58;
  size_t __n;
  long lVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  bool bVar63;
  char *local_198;
  ulong local_180;
  int local_160;
  char *outBufferEnd;
  char *local_138;
  int local_12c;
  vector<bool,_std::allocator<bool>_> decodedChannels;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  rowPtrs;
  char *src;
  short local_b0;
  int local_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [7];
  size_t outBufferSize;
  
  iVar42 = (range->max).x;
  if (this->_max[0] < iVar42) {
    iVar42 = this->_max[0];
  }
  maxY = (range->max).y;
  if (this->_max[1] < (int)maxY) {
    maxY = this->_max[1];
  }
  if ((uint)inSize < 0x58) {
    this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
    pcVar49 = "Error uncompressing DWA data(truncated header).";
  }
  else {
    iVar44 = (range->min).x;
    minY = (range->min).y;
    uVar61 = (ulong)inSize;
    lVar60 = 0;
    do {
      src = inPtr + lVar60;
      Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&src,(unsigned_long *)src);
      lVar60 = lVar60 + 8;
    } while (lVar60 != 0x58);
    uVar50 = *(ulong *)inPtr;
    pcVar49 = *(char **)(inPtr + 8);
    uVar57 = *(ulong *)(inPtr + 0x10);
    uVar62 = *(ulong *)(inPtr + 0x18);
    uVar4 = *(ulong *)(inPtr + 0x20);
    uVar5 = *(ulong *)(inPtr + 0x28);
    pcVar6 = *(char **)(inPtr + 0x30);
    uVar7 = *(ulong *)(inPtr + 0x38);
    lVar60 = *(long *)(inPtr + 0x40);
    lVar59 = *(long *)(inPtr + 0x48);
    lVar8 = *(long *)(inPtr + 0x50);
    local_138 = inPtr + 0x58;
    if ((((uVar61 < uVar5) || (uVar61 < uVar4)) || (uVar61 < uVar62)) ||
       ((uVar61 < uVar57 || (lVar46 = uVar62 + uVar57 + uVar4, uVar61 < uVar5 + lVar46 + 0x58)))) {
      this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
      pcVar49 = "Error uncompressing DWA data(truncated file).";
    }
    else if ((((long)(uVar62 | uVar4 | uVar57 | (ulong)pcVar49 | uVar5) < 0) || ((long)pcVar6 < 0))
            || (((long)uVar7 < 0 || ((lVar60 < 0 || (lVar59 < 0)))))) {
      this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
      pcVar49 = "Error uncompressing DWA data (corrupt header).";
    }
    else {
      local_12c = iVar42;
      if (uVar50 < 2) {
        initializeLegacyChannelRules(this);
LAB_001c3e87:
        outBufferSize = 0;
        initializeBuffers(this,&outBufferSize);
        iVar42 = this->_maxScanLineSize;
        iVar41 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        if (this->_outBufferSize < (ulong)((long)iVar41 * (long)iVar42)) {
          iVar42 = this->_maxScanLineSize;
          iVar41 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
          this->_outBufferSize = (long)iVar41 * (long)iVar42;
          if (this->_outBuffer != (char *)0x0) {
            operator_delete__(this->_outBuffer);
          }
          iVar42 = this->_maxScanLineSize;
          iVar41 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
          pcVar47 = (char *)operator_new__((long)iVar41 * (long)iVar42);
          this->_outBuffer = pcVar47;
        }
        pcVar47 = local_138;
        outBufferEnd = this->_outBuffer;
        if (uVar50 < 3) {
          packedAc = this->_packedAcBuffer;
          local_198 = this->_packedDcBuffer;
          setupChannelData(this,iVar44,minY,local_12c,maxY);
          if (uVar57 == 0) {
LAB_001c3fae:
            pcVar47 = pcVar47 + uVar57;
            if (uVar62 != 0) {
              raw = (unsigned_short *)this->_packedAcBuffer;
              if ((raw == (unsigned_short *)0x0) ||
                 ((char *)this->_packedAcBufferSize < (char *)(lVar60 * 2))) goto LAB_001c4bcf;
              local_160 = (int)lVar60;
              if (lVar8 == 1) {
                src = (char *)((long)local_160 * 2);
                iVar42 = ::uncompress(raw,&src,pcVar47);
                if (iVar42 == 0) {
                  if ((char *)(lVar60 * 2) == src) goto LAB_001c4063;
                  this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
                  pcVar49 = "AC data corrupt.";
                }
                else {
                  this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
                  pcVar49 = "Data decompression (zlib) failed.";
                }
                goto LAB_001c4be3;
              }
              if (lVar8 != 0) {
                this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::NoImplExc::NoImplExc((NoImplExc *)this_03,"Unknown AC Compression");
                puVar55 = &Iex_2_5::NoImplExc::typeinfo;
                pcVar51 = Iex_2_5::NoImplExc::~NoImplExc;
                goto LAB_001c4c3d;
              }
              hufUncompress(pcVar47,(int)uVar62,raw,local_160);
            }
LAB_001c4063:
            if (uVar4 != 0) {
              uVar61 = lVar59 * 2;
              if (this->_packedDcBufferSize < uVar61) goto LAB_001c4bcf;
              iVar42 = Zip::uncompress(this->_zip,pcVar47 + uVar62,(int)uVar4,this->_packedDcBuffer)
              ;
              if (uVar61 != (long)iVar42) {
                this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
                pcVar49 = "DC data corrupt.";
                goto LAB_001c4c27;
              }
            }
            if (uVar7 == 0) {
LAB_001c4137:
              src = (char *)((ulong)src & 0xffffffffffffff00);
              std::vector<bool,_std::allocator<bool>_>::vector
                        (&decodedChannels,
                         ((long)(this->_channelData).
                                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_channelData).
                                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x79435e50d79435e5,(bool *)&src,(allocator_type *)&rowPtrs);
              std::
              vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
              ::vector(&rowPtrs,((long)(this->_channelData).
                                       super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->_channelData).
                                       super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x79435e50d79435e5,(allocator_type *)&src);
              lVar60 = (long)(this->_channelData).
                             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_channelData).
                             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if (lVar60 != 0) {
                uVar61 = (lVar60 >> 3) * -0x79435e50d79435e5;
                uVar50 = 0;
                do {
                  bVar9 = (byte)uVar50 & 0x3f;
                  decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar50 >> 6] =
                       decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar50 >> 6]
                       & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
                  uVar50 = uVar50 + 1;
                } while ((uVar50 & 0xffffffff) <= uVar61 && uVar61 - (uVar50 & 0xffffffff) != 0);
              }
              outBufferEnd = this->_outBuffer;
              uVar56 = minY;
              if ((int)minY <= (int)maxY) {
                do {
                  pCVar58 = (this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pCVar58) {
                    uVar61 = 0;
                    uVar50 = 1;
                    do {
                      uVar52 = pCVar58[uVar61].ySampling;
                      if ((int)uVar56 < 0) {
                        if (-1 < (int)uVar52) {
                          uVar43 = (uVar52 + ~uVar56) / uVar52;
                          goto LAB_001c423c;
                        }
                        uVar43 = (~uVar52 - uVar56) / -uVar52;
                      }
                      else if ((int)uVar52 < 0) {
                        uVar43 = uVar56 / -uVar52;
LAB_001c423c:
                        uVar43 = -uVar43;
                      }
                      else {
                        uVar43 = uVar56 / uVar52;
                      }
                      if (uVar56 == uVar43 * uVar52) {
                        this_00 = (vector<char*,std::allocator<char*>> *)
                                  (rowPtrs.
                                   super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar61);
                        __position._M_current = *(char ***)(this_00 + 8);
                        if (__position._M_current == *(char ***)(this_00 + 0x10)) {
                          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                                    (this_00,__position,&outBufferEnd);
                        }
                        else {
                          *__position._M_current = outBufferEnd;
                          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                        }
                        iVar42 = pCVar58[uVar61].width;
                        iVar44 = pixelTypeSize(pCVar58[uVar61].type);
                        outBufferEnd = outBufferEnd + (long)iVar44 * (long)iVar42;
                      }
                      pCVar58 = (this->_channelData).
                                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar61 = ((long)(this->_channelData).
                                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar58 >>
                               3) * -0x79435e50d79435e5;
                      bVar63 = uVar50 <= uVar61;
                      lVar60 = uVar61 - uVar50;
                      uVar61 = uVar50;
                      uVar50 = (ulong)((int)uVar50 + 1);
                    } while (bVar63 && lVar60 != 0);
                  }
                  bVar63 = uVar56 != maxY;
                  uVar56 = uVar56 + 1;
                } while (bVar63);
              }
              pCVar48 = (this->_cscSets).
                        super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((this->_cscSets).
                  super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pCVar48) {
                uVar56 = 1;
                uVar61 = 0;
                do {
                  iVar42 = pCVar48[uVar61].idx[0];
                  uVar57 = (ulong)iVar42;
                  iVar44 = pCVar48[uVar61].idx[1];
                  uVar62 = (ulong)iVar44;
                  iVar41 = pCVar48[uVar61].idx[2];
                  uVar50 = (ulong)iVar41;
                  pCVar58 = (this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  LossyDctDecoderCsc::LossyDctDecoderCsc
                            ((LossyDctDecoderCsc *)&src,
                             rowPtrs.
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar57,
                             rowPtrs.
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar62,
                             rowPtrs.
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar50,packedAc,local_198,
                             (unsigned_short *)dwaCompressorToLinear,pCVar58[uVar57].width,
                             pCVar58[uVar57].height,pCVar58[uVar57].type,pCVar58[uVar62].type,
                             pCVar58[uVar50].type);
                  LossyDctDecoderBase::execute((LossyDctDecoderBase *)&src);
                  packedAc = packedAc + (long)local_ac * 2;
                  local_198 = local_198 + (long)(int)local_a8[0]._0_4_ * 2;
                  uVar61 = uVar57 + 0x3f;
                  if (-1 < (long)uVar57) {
                    uVar61 = uVar57;
                  }
                  decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [((long)uVar61 >> 6) +
                   ((ulong)((uVar57 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                       decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar61 >> 6) +
                        ((ulong)((uVar57 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                       1L << ((byte)iVar42 & 0x3f);
                  uVar61 = uVar62 + 0x3f;
                  if (-1 < (long)uVar62) {
                    uVar61 = uVar62;
                  }
                  decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [((long)uVar61 >> 6) +
                   ((ulong)((uVar62 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                       decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar61 >> 6) +
                        ((ulong)((uVar62 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                       1L << ((byte)iVar44 & 0x3f);
                  uVar61 = uVar50 + 0x3f;
                  if (-1 < (long)uVar50) {
                    uVar61 = uVar50;
                  }
                  decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [((long)uVar61 >> 6) +
                   ((ulong)((uVar50 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                       decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar61 >> 6) +
                        ((ulong)((uVar50 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                       1L << ((byte)iVar41 & 0x3f);
                  LossyDctDecoderBase::~LossyDctDecoderBase((LossyDctDecoderBase *)&src);
                  uVar61 = (ulong)uVar56;
                  pCVar48 = (this->_cscSets).
                            super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar50 = ((long)(this->_cscSets).
                                  super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar48 >> 2) *
                           -0x5555555555555555;
                  uVar56 = uVar56 + 1;
                } while (uVar61 <= uVar50 && uVar50 - uVar61 != 0);
              }
              pCVar58 = (this->_channelData).
                        super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((this->_channelData).
                  super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pCVar58) {
                local_180 = 0;
                do {
                  if ((decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [local_180 >> 6] >> (local_180 & 0x3f) & 1) == 0) {
                    uVar56 = pixelTypeSize(pCVar58[local_180].type);
                    CVar3 = pCVar58[local_180].compression;
                    if (CVar3 == UNKNOWN) {
                      iVar42 = pCVar58[local_180].width;
                      iVar44 = pixelTypeSize(pCVar58[local_180].type);
                      if ((int)minY <= (int)maxY) {
                        __n = (long)iVar44 * (long)iVar42;
                        iVar42 = 0;
                        uVar56 = minY;
                        uVar52 = ~minY;
                        do {
                          uVar43 = pCVar58[local_180].ySampling;
                          if ((int)uVar56 < 0) {
                            if (-1 < (int)uVar43) {
                              uVar45 = (uVar52 + uVar43) / uVar43;
                              goto LAB_001c46a0;
                            }
                            uVar45 = (uVar52 - uVar43) / -uVar43;
                          }
                          else if ((int)uVar43 < 0) {
                            uVar45 = uVar56 / -uVar43;
LAB_001c46a0:
                            uVar45 = -uVar45;
                          }
                          else {
                            uVar45 = uVar56 / uVar43;
                          }
                          if (uVar56 == uVar45 * uVar43) {
                            if (this->_planarUncBuffer[0] + this->_planarUncBufferSize[0] <
                                pCVar58[local_180].planarUncBufferEnd + __n) {
                              this_01 = (InputExc *)__cxa_allocate_exception(0x48);
                              Iex_2_5::InputExc::InputExc(this_01,"DWA data corrupt");
                              __cxa_throw(this_01,&Iex_2_5::InputExc::typeinfo,
                                          Iex_2_5::InputExc::~InputExc);
                            }
                            memcpy(rowPtrs.
                                   super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_180].
                                   super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar42],
                                   pCVar58[local_180].planarUncBufferEnd,__n);
                            pCVar58[local_180].planarUncBufferEnd =
                                 pCVar58[local_180].planarUncBufferEnd + __n;
                            iVar42 = iVar42 + 1;
                          }
                          uVar56 = uVar56 + 1;
                          uVar52 = uVar52 - 1;
                        } while (maxY + 1 != uVar56);
                      }
                    }
                    else if (CVar3 == LOSSY_DCT) {
                      toLinear = dwaCompressorToLinear;
                      if (pCVar58[local_180].pLinear != false) {
                        toLinear = (undefined1 *)0x0;
                      }
                      LossyDctDecoder::LossyDctDecoder
                                ((LossyDctDecoder *)&src,
                                 rowPtrs.
                                 super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_180,packedAc,
                                 local_198,(unsigned_short *)toLinear,pCVar58[local_180].width,
                                 pCVar58[local_180].height,pCVar58[local_180].type);
                      LossyDctDecoderBase::execute((LossyDctDecoderBase *)&src);
                      packedAc = packedAc + (long)local_ac * 2;
                      local_198 = local_198 + (long)(int)local_a8[0]._0_4_ * 2;
                      LossyDctDecoderBase::~LossyDctDecoderBase((LossyDctDecoderBase *)&src);
                    }
                    else {
                      if (CVar3 != RLE) {
                        this_02 = (NoImplExc *)__cxa_allocate_exception(0x48);
                        Iex_2_5::NoImplExc::NoImplExc(this_02,"Unhandled compression scheme case");
                        __cxa_throw(this_02,&Iex_2_5::NoImplExc::typeinfo,
                                    Iex_2_5::NoImplExc::~NoImplExc);
                      }
                      if ((int)minY <= (int)maxY) {
                        iVar42 = 0;
                        uVar52 = minY;
                        do {
                          uVar43 = pCVar58[local_180].ySampling;
                          if ((int)uVar52 < 0) {
                            if (-1 < (int)uVar43) {
                              uVar45 = (~uVar52 + uVar43) / uVar43;
                              goto LAB_001c478e;
                            }
                            uVar45 = (~uVar43 - uVar52) / -uVar43;
                          }
                          else if ((int)uVar43 < 0) {
                            uVar45 = uVar52 / -uVar43;
LAB_001c478e:
                            uVar45 = -uVar45;
                          }
                          else {
                            uVar45 = uVar52 / uVar43;
                          }
                          if (uVar52 == uVar45 * uVar43) {
                            pcVar49 = rowPtrs.
                                      super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[local_180].
                                      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar42];
                            if (uVar56 == 2) {
                              pcVar6 = pCVar58[local_180].planarUncRleEnd[0];
                              pcVar47 = pCVar58[local_180].planarUncRleEnd[1];
                              uVar43 = pCVar58[local_180].width;
                              lVar60 = (long)(int)uVar43;
                              uVar45 = uVar43 + 0xf;
                              if (-1 < lVar60) {
                                uVar45 = uVar43;
                              }
                              uVar45 = (int)uVar45 >> 4;
                              uVar61 = (ulong)uVar45;
                              if ((((uint)pcVar6 | (uint)pcVar47 | (uint)pcVar49) & 0xf) == 0) {
                                if (0xf < (int)uVar43) {
                                  lVar59 = 0;
                                  do {
                                    pcVar1 = pcVar6 + lVar59;
                                    cVar10 = pcVar1[1];
                                    cVar11 = pcVar1[2];
                                    cVar12 = pcVar1[3];
                                    cVar13 = pcVar1[4];
                                    cVar14 = pcVar1[5];
                                    cVar15 = pcVar1[6];
                                    cVar16 = pcVar1[7];
                                    cVar17 = pcVar1[8];
                                    cVar18 = pcVar1[9];
                                    cVar19 = pcVar1[10];
                                    cVar20 = pcVar1[0xb];
                                    cVar21 = pcVar1[0xc];
                                    cVar22 = pcVar1[0xd];
                                    cVar23 = pcVar1[0xe];
                                    cVar24 = pcVar1[0xf];
                                    pcVar2 = pcVar47 + lVar59;
                                    cVar25 = *pcVar2;
                                    cVar26 = pcVar2[1];
                                    cVar27 = pcVar2[2];
                                    cVar28 = pcVar2[3];
                                    cVar29 = pcVar2[4];
                                    cVar30 = pcVar2[5];
                                    cVar31 = pcVar2[6];
                                    cVar32 = pcVar2[7];
                                    cVar33 = pcVar2[8];
                                    cVar34 = pcVar2[9];
                                    cVar35 = pcVar2[10];
                                    cVar36 = pcVar2[0xb];
                                    cVar37 = pcVar2[0xc];
                                    cVar38 = pcVar2[0xd];
                                    cVar39 = pcVar2[0xe];
                                    cVar40 = pcVar2[0xf];
                                    pcVar2 = pcVar49 + lVar59 * 2;
                                    *pcVar2 = *pcVar1;
                                    pcVar2[1] = cVar25;
                                    pcVar2[2] = cVar10;
                                    pcVar2[3] = cVar26;
                                    pcVar2[4] = cVar11;
                                    pcVar2[5] = cVar27;
                                    pcVar2[6] = cVar12;
                                    pcVar2[7] = cVar28;
                                    pcVar2[8] = cVar13;
                                    pcVar2[9] = cVar29;
                                    pcVar2[10] = cVar14;
                                    pcVar2[0xb] = cVar30;
                                    pcVar2[0xc] = cVar15;
                                    pcVar2[0xd] = cVar31;
                                    pcVar2[0xe] = cVar16;
                                    pcVar2[0xf] = cVar32;
                                    pcVar1 = pcVar49 + lVar59 * 2 + 0x10;
                                    *pcVar1 = cVar17;
                                    pcVar1[1] = cVar33;
                                    pcVar1[2] = cVar18;
                                    pcVar1[3] = cVar34;
                                    pcVar1[4] = cVar19;
                                    pcVar1[5] = cVar35;
                                    pcVar1[6] = cVar20;
                                    pcVar1[7] = cVar36;
                                    pcVar1[8] = cVar21;
                                    pcVar1[9] = cVar37;
                                    pcVar1[10] = cVar22;
                                    pcVar1[0xb] = cVar38;
                                    pcVar1[0xc] = cVar23;
                                    pcVar1[0xd] = cVar39;
                                    pcVar1[0xe] = cVar24;
                                    pcVar1[0xf] = cVar40;
                                    lVar59 = lVar59 + 0x10;
                                    uVar61 = uVar61 - 1;
                                  } while (uVar61 != 0);
                                }
                                if ((int)(uVar45 * 0x10) < (int)uVar43) {
                                  lVar59 = (long)(int)(uVar45 * 0x10);
                                  do {
                                    pcVar49[lVar59 * 2] = pcVar6[lVar59];
                                    pcVar49[lVar59 * 2 + 1] = pcVar47[lVar59];
                                    lVar59 = lVar59 + 1;
                                  } while (lVar60 != lVar59);
                                }
                              }
                              else if (((((ulong)pcVar49 & 0xf) == 0) && (((uint)pcVar6 & 0xf) == 8)
                                       ) && (((uint)pcVar47 & 0xf) == 8)) {
                                if (0 < (int)uVar43) {
                                  uVar61 = 8;
                                  if ((int)uVar43 < 8) {
                                    uVar61 = (ulong)uVar43;
                                  }
                                  uVar50 = 0;
                                  do {
                                    pcVar49[uVar50 * 2] = pcVar6[uVar50];
                                    pcVar49[uVar50 * 2 + 1] = pcVar47[uVar50];
                                    uVar50 = uVar50 + 1;
                                  } while (uVar61 != uVar50);
                                }
                                if (8 < (int)uVar43) {
                                  uVar61 = lVar60 - 8;
                                  if (0xf < (uint)uVar61) {
                                    uVar50 = 0;
                                    do {
                                      pcVar1 = pcVar6 + uVar50 + 8;
                                      cVar10 = pcVar1[1];
                                      cVar11 = pcVar1[2];
                                      cVar12 = pcVar1[3];
                                      cVar13 = pcVar1[4];
                                      cVar14 = pcVar1[5];
                                      cVar15 = pcVar1[6];
                                      cVar16 = pcVar1[7];
                                      pcVar2 = pcVar47 + uVar50 + 8;
                                      cVar17 = *pcVar2;
                                      cVar18 = pcVar2[1];
                                      cVar19 = pcVar2[2];
                                      cVar20 = pcVar2[3];
                                      cVar21 = pcVar2[4];
                                      cVar22 = pcVar2[5];
                                      cVar23 = pcVar2[6];
                                      cVar24 = pcVar2[7];
                                      pcVar2 = pcVar49 + uVar50 * 2 + 0x10;
                                      *pcVar2 = *pcVar1;
                                      pcVar2[1] = cVar17;
                                      pcVar2[2] = cVar10;
                                      pcVar2[3] = cVar18;
                                      pcVar2[4] = cVar11;
                                      pcVar2[5] = cVar19;
                                      pcVar2[6] = cVar12;
                                      pcVar2[7] = cVar20;
                                      pcVar2[8] = cVar13;
                                      pcVar2[9] = cVar21;
                                      pcVar2[10] = cVar14;
                                      pcVar2[0xb] = cVar22;
                                      pcVar2[0xc] = cVar15;
                                      pcVar2[0xd] = cVar23;
                                      pcVar2[0xe] = cVar16;
                                      pcVar2[0xf] = cVar24;
                                      cVar10 = pcVar6[uVar50 + 0x11];
                                      cVar11 = pcVar6[uVar50 + 0x12];
                                      cVar12 = pcVar6[uVar50 + 0x13];
                                      cVar13 = pcVar6[uVar50 + 0x14];
                                      cVar14 = pcVar6[uVar50 + 0x15];
                                      cVar15 = pcVar6[uVar50 + 0x16];
                                      cVar16 = pcVar6[uVar50 + 0x17];
                                      cVar17 = pcVar47[uVar50 + 0x10];
                                      cVar18 = pcVar47[uVar50 + 0x11];
                                      cVar19 = pcVar47[uVar50 + 0x12];
                                      cVar20 = pcVar47[uVar50 + 0x13];
                                      cVar21 = pcVar47[uVar50 + 0x14];
                                      cVar22 = pcVar47[uVar50 + 0x15];
                                      cVar23 = pcVar47[uVar50 + 0x16];
                                      cVar24 = pcVar47[uVar50 + 0x17];
                                      pcVar1 = pcVar49 + uVar50 * 2 + 0x20;
                                      *pcVar1 = pcVar6[uVar50 + 0x10];
                                      pcVar1[1] = cVar17;
                                      pcVar1[2] = cVar10;
                                      pcVar1[3] = cVar18;
                                      pcVar1[4] = cVar11;
                                      pcVar1[5] = cVar19;
                                      pcVar1[6] = cVar12;
                                      pcVar1[7] = cVar20;
                                      pcVar1[8] = cVar13;
                                      pcVar1[9] = cVar21;
                                      pcVar1[10] = cVar14;
                                      pcVar1[0xb] = cVar22;
                                      pcVar1[0xc] = cVar15;
                                      pcVar1[0xd] = cVar23;
                                      pcVar1[0xe] = cVar16;
                                      pcVar1[0xf] = cVar24;
                                      uVar50 = uVar50 + 0x10;
                                    } while ((((uint)(uVar61 >> 4) & 0xfffffff) +
                                             (uint)((uVar61 >> 4 & 0xfffffff) == 0)) * 0x10 !=
                                             uVar50);
                                  }
                                  uVar50 = uVar61 & 0xfffffffffffffff0;
                                  if ((int)uVar50 + 8 < (int)uVar43) {
                                    do {
                                      pcVar49[uVar50 * 2 + 0x10] = pcVar6[uVar50 + 8];
                                      pcVar49[uVar50 * 2 + 0x11] = pcVar47[uVar50 + 8];
                                      uVar50 = uVar50 + 1;
                                    } while (uVar61 != uVar50);
                                  }
                                }
                              }
                              else {
                                if (0xf < (int)uVar43) {
                                  lVar59 = 0;
                                  do {
                                    pcVar1 = pcVar6 + lVar59;
                                    cVar10 = pcVar1[1];
                                    cVar11 = pcVar1[2];
                                    cVar12 = pcVar1[3];
                                    cVar13 = pcVar1[4];
                                    cVar14 = pcVar1[5];
                                    cVar15 = pcVar1[6];
                                    cVar16 = pcVar1[7];
                                    cVar17 = pcVar1[8];
                                    cVar18 = pcVar1[9];
                                    cVar19 = pcVar1[10];
                                    cVar20 = pcVar1[0xb];
                                    cVar21 = pcVar1[0xc];
                                    cVar22 = pcVar1[0xd];
                                    cVar23 = pcVar1[0xe];
                                    cVar24 = pcVar1[0xf];
                                    pcVar2 = pcVar47 + lVar59;
                                    cVar25 = *pcVar2;
                                    cVar26 = pcVar2[1];
                                    cVar27 = pcVar2[2];
                                    cVar28 = pcVar2[3];
                                    cVar29 = pcVar2[4];
                                    cVar30 = pcVar2[5];
                                    cVar31 = pcVar2[6];
                                    cVar32 = pcVar2[7];
                                    cVar33 = pcVar2[8];
                                    cVar34 = pcVar2[9];
                                    cVar35 = pcVar2[10];
                                    cVar36 = pcVar2[0xb];
                                    cVar37 = pcVar2[0xc];
                                    cVar38 = pcVar2[0xd];
                                    cVar39 = pcVar2[0xe];
                                    cVar40 = pcVar2[0xf];
                                    pcVar2 = pcVar49 + lVar59 * 2;
                                    *pcVar2 = *pcVar1;
                                    pcVar2[1] = cVar25;
                                    pcVar2[2] = cVar10;
                                    pcVar2[3] = cVar26;
                                    pcVar2[4] = cVar11;
                                    pcVar2[5] = cVar27;
                                    pcVar2[6] = cVar12;
                                    pcVar2[7] = cVar28;
                                    pcVar2[8] = cVar13;
                                    pcVar2[9] = cVar29;
                                    pcVar2[10] = cVar14;
                                    pcVar2[0xb] = cVar30;
                                    pcVar2[0xc] = cVar15;
                                    pcVar2[0xd] = cVar31;
                                    pcVar2[0xe] = cVar16;
                                    pcVar2[0xf] = cVar32;
                                    pcVar1 = pcVar49 + lVar59 * 2 + 0x10;
                                    *pcVar1 = cVar17;
                                    pcVar1[1] = cVar33;
                                    pcVar1[2] = cVar18;
                                    pcVar1[3] = cVar34;
                                    pcVar1[4] = cVar19;
                                    pcVar1[5] = cVar35;
                                    pcVar1[6] = cVar20;
                                    pcVar1[7] = cVar36;
                                    pcVar1[8] = cVar21;
                                    pcVar1[9] = cVar37;
                                    pcVar1[10] = cVar22;
                                    pcVar1[0xb] = cVar38;
                                    pcVar1[0xc] = cVar23;
                                    pcVar1[0xd] = cVar39;
                                    pcVar1[0xe] = cVar24;
                                    pcVar1[0xf] = cVar40;
                                    lVar59 = lVar59 + 0x10;
                                    uVar61 = uVar61 - 1;
                                  } while (uVar61 != 0);
                                }
                                if ((int)(uVar45 * 0x10) < (int)uVar43) {
                                  lVar59 = (long)(int)(uVar45 * 0x10);
                                  do {
                                    pcVar49[lVar59 * 2] = pcVar6[lVar59];
                                    pcVar49[lVar59 * 2 + 1] = pcVar47[lVar59];
                                    lVar59 = lVar59 + 1;
                                  } while (lVar60 != lVar59);
                                }
                              }
                              pCVar58[local_180].planarUncRleEnd[0] =
                                   pCVar58[local_180].planarUncRleEnd[0] + pCVar58[local_180].width;
                              pCVar58[local_180].planarUncRleEnd[1] =
                                   pCVar58[local_180].planarUncRleEnd[1] + pCVar58[local_180].width;
                            }
                            else if (0 < pCVar58[local_180].width) {
                              iVar44 = 0;
                              do {
                                if (0 < (int)uVar56) {
                                  uVar61 = 0;
                                  do {
                                    pcVar6 = pCVar58[local_180].planarUncRleEnd[uVar61];
                                    pCVar58[local_180].planarUncRleEnd[uVar61] = pcVar6 + 1;
                                    pcVar49[uVar61] = *pcVar6;
                                    uVar61 = uVar61 + 1;
                                  } while (uVar56 != uVar61);
                                  pcVar49 = pcVar49 + uVar61;
                                }
                                iVar44 = iVar44 + 1;
                              } while (iVar44 < pCVar58[local_180].width);
                            }
                            iVar42 = iVar42 + 1;
                          }
                          bVar63 = uVar52 != maxY;
                          uVar52 = uVar52 + 1;
                        } while (bVar63);
                      }
                    }
                    decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_180 >> 6]
                         = decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [local_180 >> 6] | 1L << ((byte)local_180 & 0x3f);
                  }
                  local_180 = (ulong)((int)local_180 + 1);
                  pCVar58 = (this->_channelData).
                            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar61 = ((long)(this->_channelData).
                                  super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar58 >> 3) *
                           -0x79435e50d79435e5;
                } while (local_180 <= uVar61 && uVar61 - local_180 != 0);
              }
              pcVar6 = outBufferEnd;
              *outPtr = this->_outBuffer;
              pcVar49 = this->_outBuffer;
              std::
              vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
              ::~vector(&rowPtrs);
              if (decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_type *)0x0) {
                operator_delete(decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                (long)decodedChannels.super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl.super__Bvector_impl_data._M_end_of_storage -
                                (long)decodedChannels.super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl.super__Bvector_impl_data._M_start.
                                      super__Bit_iterator_base._M_p);
              }
              return (int)pcVar6 - (int)pcVar49;
            }
            if ((pcVar6 <= (char *)this->_rleBufferSize) && (uVar7 <= this->_planarUncBufferSize[2])
               ) {
              src = pcVar6;
              iVar42 = ::uncompress(this->_rleBuffer,&src,pcVar47 + uVar62 + uVar4,uVar5);
              if (iVar42 == 0) {
                if ((src == pcVar6) &&
                   (iVar42 = rleUncompress((int)pcVar6,(int)uVar7,this->_rleBuffer,
                                           this->_planarUncBuffer[2]), uVar7 == (long)iVar42))
                goto LAB_001c4137;
                this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
                pcVar49 = "RLE data corrupted";
              }
              else {
                this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
                pcVar49 = "Error uncompressing RLE data.";
              }
              goto LAB_001c4c27;
            }
          }
          else if (pcVar49 <= (char *)this->_planarUncBufferSize[0]) {
            src = pcVar49;
            iVar42 = ::uncompress(this->_planarUncBuffer[0],&src,pcVar47,uVar57);
            if (iVar42 == 0) goto LAB_001c3fae;
            this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
            pcVar49 = "Error uncompressing UNKNOWN data.";
LAB_001c4c27:
            Iex_2_5::BaseExc::BaseExc(this_03,pcVar49);
            puVar55 = &Iex_2_5::BaseExc::typeinfo;
            pcVar51 = Iex_2_5::BaseExc::~BaseExc;
            goto LAB_001c4c3d;
          }
LAB_001c4bcf:
          this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
          pcVar49 = "Error uncompressing DWA data(corrupt header).";
        }
        else {
          this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
          pcVar49 = "Invalid version of compressed data block";
        }
      }
      else {
        uVar53 = *(ushort *)(inPtr + 0x58);
        local_138 = inPtr + 0x5a;
        if (uVar53 < 2) {
          this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
          pcVar49 = "Error uncompressing DWA data (corrupt header file).";
        }
        else {
          if (lVar46 + uVar5 + (ulong)uVar53 + 0x58 <= uVar61) {
            std::
            vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
            ::_M_erase_at_end(&this->_channelRules,
                              (this->_channelRules).
                              super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            uVar53 = uVar53 - 2;
            if (uVar53 != 0) {
              do {
                Classifier::Classifier((Classifier *)&src,&local_138,(uint)uVar53);
                std::
                vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                ::push_back(&this->_channelRules,(Classifier *)&src);
                sVar54 = uVar53 - local_b0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)src != local_a8) {
                  operator_delete(src,CONCAT44(local_a8[0]._M_allocated_capacity._4_4_,
                                               (undefined4)local_a8[0]._M_allocated_capacity) + 1);
                }
                uVar53 = sVar54 - 3;
              } while (uVar53 != 0);
            }
            goto LAB_001c3e87;
          }
          this_03 = (BaseExc *)__cxa_allocate_exception(0x48);
          pcVar49 = "Error uncompressing DWA data (truncated file).";
        }
      }
    }
  }
LAB_001c4be3:
  Iex_2_5::InputExc::InputExc((InputExc *)this_03,pcVar49);
  puVar55 = &Iex_2_5::InputExc::typeinfo;
  pcVar51 = Iex_2_5::InputExc::~InputExc;
LAB_001c4c3d:
  __cxa_throw(this_03,puVar55,pcVar51);
}

Assistant:

int 
DwaCompressor::uncompress
    (const char *inPtr,
     int inSize,
     IMATH_NAMESPACE::Box2i range,
     const char *&outPtr)
{
    int minX = range.min.x;
    int maxX = std::min (range.max.x, _max[0]);
    int minY = range.min.y;
    int maxY = std::min (range.max.y, _max[1]);

    Int64 iSize = static_cast<Int64>( inSize );
    Int64 headerSize = NUM_SIZES_SINGLE*sizeof(Int64);
    if (iSize < headerSize) 
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            "(truncated header).");
    }

    // 
    // Flip the counters from XDR to NATIVE
    //

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64      *dst =  (((Int64 *)inPtr) + i);
        const char *src = (char *)(((Int64 *)inPtr) + i);

        Xdr::read<CharPtrIO> (src, *dst);
    }

    //
    // Unwind all the counter info
    //

    const Int64 *inPtr64 = (const Int64*) inPtr;

    Int64 version                  = *(inPtr64 + VERSION);
    Int64 unknownUncompressedSize  = *(inPtr64 + UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 unknownCompressedSize    = *(inPtr64 + UNKNOWN_COMPRESSED_SIZE);
    Int64 acCompressedSize         = *(inPtr64 + AC_COMPRESSED_SIZE);
    Int64 dcCompressedSize         = *(inPtr64 + DC_COMPRESSED_SIZE);
    Int64 rleCompressedSize        = *(inPtr64 + RLE_COMPRESSED_SIZE);
    Int64 rleUncompressedSize      = *(inPtr64 + RLE_UNCOMPRESSED_SIZE);
    Int64 rleRawSize               = *(inPtr64 + RLE_RAW_SIZE);
 
    Int64 totalAcUncompressedCount = *(inPtr64 + AC_UNCOMPRESSED_COUNT); 
    Int64 totalDcUncompressedCount = *(inPtr64 + DC_UNCOMPRESSED_COUNT); 

    Int64 acCompression            = *(inPtr64 + AC_COMPRESSION); 

    Int64 compressedSize           = unknownCompressedSize + 
                                     acCompressedSize +
                                     dcCompressedSize +
                                     rleCompressedSize;

    const char *dataPtr            = inPtr + NUM_SIZES_SINGLE * sizeof(Int64);

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize ||
        iSize < acCompressedSize ||
        iSize < dcCompressedSize ||
        iSize < rleCompressedSize)
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            "(truncated file).");
    }

    if ((SInt64)unknownUncompressedSize < 0  ||
        (SInt64)unknownCompressedSize < 0    ||
        (SInt64)acCompressedSize < 0         ||
        (SInt64)dcCompressedSize < 0         ||
        (SInt64)rleCompressedSize < 0        ||
        (SInt64)rleUncompressedSize < 0      ||
        (SInt64)rleRawSize < 0               ||
        (SInt64)totalAcUncompressedCount < 0 ||
        (SInt64)totalDcUncompressedCount < 0)
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            " (corrupt header).");
    }

    if (version < 2) 
        initializeLegacyChannelRules();
    else
    {
        unsigned short ruleSize = 0;
        Xdr::read<CharPtrIO>(dataPtr, ruleSize);

        if (ruleSize < Xdr::size<unsigned short>() ) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt header file).");

        headerSize += ruleSize;
        if (iSize < headerSize + compressedSize)
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated file).");

        _channelRules.clear();
        ruleSize -= Xdr::size<unsigned short> ();
        while (ruleSize > 0) 
        {
            Classifier rule(dataPtr, ruleSize);
            
            _channelRules.push_back(rule);
            ruleSize -= rule.size();
        }
    }


    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    if (static_cast<size_t>(_maxScanLineSize * numScanLines()) > _outBufferSize) 
    {
        _outBufferSize = static_cast<size_t>(_maxScanLineSize * numScanLines());
        if (_outBuffer != 0)
            delete[] _outBuffer;
        _outBuffer = new char[_maxScanLineSize * numScanLines()];
    }


    char *outBufferEnd = _outBuffer;

       
    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy   
    // if you want to decode the channels in parallel later on.
    //

    char *packedAcBufferEnd = 0; 

    if (_packedAcBuffer)
        packedAcBufferEnd = _packedAcBuffer;

    char *packedDcBufferEnd = 0;

    if (_packedDcBuffer)
        packedDcBufferEnd = _packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the 
    // Huffman-compressed AC, then the DC values, 
    // and then the zlib compressed RLE data.
    //
    
    const char *compressedUnknownBuf = dataPtr;

    const char *compressedAcBuf      = compressedUnknownBuf + 
                                  static_cast<ptrdiff_t>(unknownCompressedSize);
    const char *compressedDcBuf      = compressedAcBuf +
                                  static_cast<ptrdiff_t>(acCompressedSize);
    const char *compressedRleBuf     = compressedDcBuf + 
                                  static_cast<ptrdiff_t>(dcCompressedSize);

    // 
    // Sanity check that the version is something we expect. Right now, 
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the 
    // start of the data block.
    //

    if (version > 2)
        throw IEX_NAMESPACE::InputExc ("Invalid version of compressed data block");    

    setupChannelData(minX, minY, maxX, maxY);

    // 
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > _planarUncBufferSize[UNKNOWN]) 
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        uLongf outSize = (uLongf)unknownUncompressedSize;

        if (Z_OK != ::uncompress
                        ((Bytef *)_planarUncBuffer[UNKNOWN],
                         &outSize,
                         (Bytef *)compressedUnknownBuf,
                         (uLong)unknownCompressedSize))
        {
            throw IEX_NAMESPACE::BaseExc("Error uncompressing UNKNOWN data.");
        }
    }

    // 
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if ( !_packedAcBuffer || totalAcUncompressedCount*sizeof(unsigned short) > _packedAcBufferSize)
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
          case STATIC_HUFFMAN:

            hufUncompress
                (compressedAcBuf, 
                 (int)acCompressedSize, 
                 (unsigned short *)_packedAcBuffer, 
                 (int)totalAcUncompressedCount); 

            break;

          case DEFLATE:
            {
                uLongf destLen =
                    (int)(totalAcUncompressedCount) * sizeof (unsigned short);

                if (Z_OK != ::uncompress
                                ((Bytef *)_packedAcBuffer,
                                 &destLen,
                                 (Bytef *)compressedAcBuf,
                                 (uLong)acCompressedSize))
                {
                    throw IEX_NAMESPACE::InputExc ("Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (unsigned short) !=
                                destLen)
                {
                    throw IEX_NAMESPACE::InputExc ("AC data corrupt.");     
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
            break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        if (totalDcUncompressedCount*sizeof(unsigned short) > _packedDcBufferSize)
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        if (static_cast<Int64>(_zip->uncompress
                    (compressedDcBuf, (int)dcCompressedSize, _packedDcBuffer))
            != totalDcUncompressedCount * sizeof (unsigned short))
        {
            throw IEX_NAMESPACE::BaseExc("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > _rleBufferSize ||
            rleRawSize > _planarUncBufferSize[RLE])
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }
 
        uLongf dstLen = (uLongf)rleUncompressedSize;

        if (Z_OK != ::uncompress
                        ((Bytef *)_rleBuffer,
                         &dstLen,
                         (Bytef *)compressedRleBuf,
                         (uLong)rleCompressedSize))
        {
            throw IEX_NAMESPACE::BaseExc("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
            throw IEX_NAMESPACE::BaseExc("RLE data corrupted");

        if (static_cast<Int64>(rleUncompress
                ((int)rleUncompressedSize, 
                 (int)rleRawSize,
                 (signed char *)_rleBuffer,
                 _planarUncBuffer[RLE])) != rleRawSize)
        {        
            throw IEX_NAMESPACE::BaseExc("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //

    std::vector<bool> decodedChannels (_channelData.size());
    std::vector< std::vector<char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        decodedChannels[chan] = false;

    outBufferEnd = _outBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {
            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back (outBufferEnd);
            outBufferEnd += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {
        int rChan = _cscSets[csc].idx[0];    
        int gChan = _cscSets[csc].idx[1];    
        int bChan = _cscSets[csc].idx[2];    


        LossyDctDecoderCsc decoder
            (rowPtrs[rChan],
             rowPtrs[gChan],
             rowPtrs[bChan],
             packedAcBufferEnd,
             packedDcBufferEnd,
             dwaCompressorToLinear,
             _channelData[rChan].width,
             _channelData[rChan].height,
             _channelData[rChan].type,
             _channelData[gChan].type,
             _channelData[bChan].type);

        decoder.execute();

        packedAcBufferEnd +=
            decoder.numAcValuesEncoded() * sizeof (unsigned short);

        packedDcBufferEnd +=
            decoder.numDcValuesEncoded() * sizeof (unsigned short);

        decodedChannels[rChan] = true;
        decodedChannels[gChan] = true;
        decodedChannels[bChan] = true;
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        if (decodedChannels[chan])
            continue;

        ChannelData *cd = &_channelData[chan];
        int pixelSize = OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // Setup a single-channel lossy DCT decoder pointing
            // at the output buffer
            //

            {
                const unsigned short *linearLut = 0;

                if (!cd->pLinear)
                    linearLut = dwaCompressorToLinear;

                LossyDctDecoder decoder
                    (rowPtrs[chan],
                     packedAcBufferEnd,
                     packedDcBufferEnd,
                     linearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                decoder.execute();   

                packedAcBufferEnd += 
                    decoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcBufferEnd += 
                    decoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For the RLE case, the data has been un-RLE'd into
            // planarUncRleEnd[], but is still split out by bytes.
            // We need to rearrange the bytes back into the correct
            // order in the output buffer;
            //

            {
                int row = 0;

                for (int y = minY; y <= maxY; ++y)
                {
                    if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                        continue;

                    char *dst = rowPtrs[chan][row];

                    if (pixelSize == 2)
                    {
                        interleaveByte2 (dst, 
                                         cd->planarUncRleEnd[0],
                                         cd->planarUncRleEnd[1],
                                         cd->width);
                                            
                        cd->planarUncRleEnd[0] += cd->width;
                        cd->planarUncRleEnd[1] += cd->width;
                    }
                    else
                    {
                        for (int x = 0; x < cd->width; ++x)
                        {
                            for (int byte = 0; byte < pixelSize; ++byte)
                            {
                               *dst++ = *cd->planarUncRleEnd[byte]++;
                            }
                        }
                    }

                    row++;
                }
            }

            break;

          case UNKNOWN:

            //
            // In the UNKNOWN case, data is already in planarUncBufferEnd
            // and just needs to copied over to the output buffer
            //

            {
                int row             = 0;
                int dstScanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

                for (int y = minY; y <= maxY; ++y)
                {
                    if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                        continue;

                    //
                    // sanity check for buffer data lying within range
                    //
                    if ((cd->planarUncBufferEnd + static_cast<size_t>(dstScanlineSize))  > (_planarUncBuffer[UNKNOWN] + _planarUncBufferSize[UNKNOWN]) )
                    {
                        throw Iex::InputExc("DWA data corrupt");
                    }

                    memcpy (rowPtrs[chan][row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                    cd->planarUncBufferEnd += dstScanlineSize;
                    row++;
                }
            }

            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }

        decodedChannels[chan] = true;
    }

    //
    // Return a ptr to _outBuffer
    //

    outPtr = _outBuffer;
    return (int)(outBufferEnd - _outBuffer);
}